

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-spell.c
# Opt level: O0

menu_conflict *
spell_menu_new(object *obj,_func__Bool_player_ptr_wchar_t *is_valid,_Bool show_description)

{
  _Bool _Var1;
  wchar_t wVar2;
  menu_conflict *menu;
  int **spells;
  int local_5c;
  int local_58;
  int local_54;
  undefined1 local_50 [8];
  region_conflict loc;
  size_t width;
  spell_menu_data *d;
  menu_conflict *m;
  _Bool show_description_local;
  _func__Bool_player_ptr_wchar_t *is_valid_local;
  object *obj_local;
  
  menu = menu_new(MN_SKIN_SCROLL,&spell_menu_iter);
  spells = (int **)mem_alloc(0x20);
  if (Term->wid + -0xf < 0x51) {
    local_54 = Term->wid + -0xf;
  }
  else {
    local_54 = 0x50;
  }
  if (local_54 < 1) {
    local_5c = 0;
  }
  else {
    if (Term->wid + -0xf < 0x51) {
      local_58 = Term->wid + -0xf;
    }
    else {
      local_58 = 0x50;
    }
    local_5c = local_58;
  }
  loc._8_8_ = SEXT48(local_5c);
  local_50._0_4_ = -local_5c;
  local_50._4_4_ = 1;
  loc.col = local_5c;
  loc.row = -99;
  wVar2 = spell_collect_from_book(player,obj,spells);
  *(wchar_t *)(spells + 1) = wVar2;
  if ((*(int *)(spells + 1) != 0) &&
     (_Var1 = spell_okay_list(player,is_valid,*spells,*(wchar_t *)(spells + 1)), _Var1)) {
    spells[2] = (int *)is_valid;
    *(undefined4 *)((long)spells + 0x1c) = 0xffffffff;
    *(undefined1 *)((long)spells + 0xc) = 0;
    *(_Bool *)(spells + 3) = show_description;
    menu_setpriv(menu,*(int *)(spells + 1),spells);
    menu->header = "Name                             Lv Mana Fail Info";
    menu->flags = 8;
    menu->selections = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
    menu->browse_hook = spell_menu_browser;
    menu->cmd_keys = "?";
    loc.row = *(int *)(spells + 1) + 1;
    menu_layout(menu,(region_conflict *)local_50);
    return menu;
  }
  mem_free(menu);
  mem_free(*spells);
  mem_free(spells);
  return (menu_conflict *)0x0;
}

Assistant:

static struct menu *spell_menu_new(const struct object *obj,
		bool (*is_valid)(const struct player *p, int spell_index),
		bool show_description)
{
	struct menu *m = menu_new(MN_SKIN_SCROLL, &spell_menu_iter);
	struct spell_menu_data *d = mem_alloc(sizeof *d);
	size_t width = MAX(0, MIN(Term->wid - 15, 80));

	region loc = { 0 - width, 1, width, -99 };

	/* collect spells from object */
	d->n_spells = spell_collect_from_book(player, obj, &d->spells);
	if (d->n_spells == 0 || !spell_okay_list(player, is_valid, d->spells, d->n_spells)) {
		mem_free(m);
		mem_free(d->spells);
		mem_free(d);
		return NULL;
	}

	/* Copy across private data */
	d->is_valid = is_valid;
	d->selected_spell = -1;
	d->browse = false;
	d->show_description = show_description;

	menu_setpriv(m, d->n_spells, d);

	/* Set flags */
	m->header = "Name                             Lv Mana Fail Info";
	m->flags = MN_CASELESS_TAGS;
	m->selections = all_letters_nohjkl;
	m->browse_hook = spell_menu_browser;
	m->cmd_keys = "?";

	/* Set size */
	loc.page_rows = d->n_spells + 1;
	menu_layout(m, &loc);

	return m;
}